

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

AltNode * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AppendSurrogatePairToDisjunction
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,codepoint_t codePoint,
          AltNode *lastAltNode)

{
  undefined1 *puVar1;
  undefined8 in_RAX;
  AltNode *pAVar2;
  Node *pNVar3;
  undefined4 local_34;
  char16 lower;
  char16 upper;
  
  local_34 = (undefined4)((ulong)in_RAX >> 0x20);
  Js::NumberUtilities::CodePointAsSurrogatePair
            (codePoint,(char16 *)&local_34,(char16 *)((long)&local_34 + 2));
  pAVar2 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x364470);
  pNVar3 = CreateSurrogatePairAtom(this,(char16)local_34,local_34._2_2_);
  (pAVar2->super_Node).tag = Alt;
  (pAVar2->super_Node).features = 0;
  puVar1 = &(pAVar2->super_Node).field_0xc;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
  (pAVar2->super_Node).firstSet = (CharSet<char16_t> *)0x0;
  (pAVar2->super_Node).followSet = (CharSet<char16_t> *)0x0;
  (pAVar2->super_Node).prevConsumes.lower = 0;
  *(undefined8 *)&(pAVar2->super_Node).prevConsumes.upper = 0xffffffff;
  *(undefined8 *)&(pAVar2->super_Node).thisConsumes.upper = 0xffffffff;
  (pAVar2->super_Node).followConsumes.upper = 0xffffffff;
  (pAVar2->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
  pAVar2->head = pNVar3;
  pAVar2->switchSize = 0;
  pAVar2->tail = (AltNode *)0x0;
  pAVar2->runtimeTrie = (RuntimeCharTrie *)0x0;
  *(undefined8 *)((long)&pAVar2->runtimeTrie + 5) = 0;
  if (lastAltNode != (AltNode *)0x0) {
    lastAltNode->tail = pAVar2;
  }
  return pAVar2;
}

Assistant:

AltNode* Parser<P, IsLiteral>::AppendSurrogatePairToDisjunction(codepoint_t codePoint, AltNode *lastAltNode)
    {
        char16 lower, upper;
        Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &upper);

        AltNode* tailNode = Anew(ctAllocator, AltNode, CreateSurrogatePairAtom(lower, upper), nullptr);

        if (lastAltNode != nullptr)
        {
            lastAltNode->tail = tailNode;
        }

        return tailNode;
    }